

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.cpp
# Opt level: O0

RPCHelpMan * wallet::walletpassphrasechange(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff848;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff850;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff880;
  allocator<char> *in_stack_fffffffffffff888;
  iterator in_stack_fffffffffffff890;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff898;
  string *in_stack_fffffffffffff8a0;
  Fallback *in_stack_fffffffffffff8a8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff8b0;
  string *in_stack_fffffffffffff8b8;
  RPCArg *in_stack_fffffffffffff8c0;
  RPCResults *this_00;
  RPCResult *this_01;
  RPCExamples *in_stack_fffffffffffff990;
  pointer results;
  pointer args;
  pointer description;
  undefined8 in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  allocator<char> local_621 [7];
  allocator<char> local_61a;
  allocator<char> local_619 [8];
  allocator<char> local_611 [31];
  allocator<char> local_5f2;
  allocator<char> local_5f1 [161];
  RPCMethodImpl *in_stack_fffffffffffffab0;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_619[1] = (allocator<char>)0x0;
  local_619[2] = (allocator<char>)0x0;
  local_619[3] = (allocator<char>)0x0;
  local_619[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff858,(Optional *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::__cxx11::string::string(in_stack_fffffffffffff860);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff848);
  RPCArg::RPCArg(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                 (Type)((ulong)in_stack_fffffffffffff8b0 >> 0x20),in_stack_fffffffffffff8a8,
                 in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_621[1] = (allocator<char>)0x0;
  local_621[2] = (allocator<char>)0x0;
  local_621[3] = (allocator<char>)0x0;
  local_621[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff858,(Optional *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::__cxx11::string::string(in_stack_fffffffffffff860);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff848);
  RPCArg::RPCArg(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                 (Type)((ulong)in_stack_fffffffffffff8b0 >> 0x20),in_stack_fffffffffffff8a8,
                 in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff8a8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff848);
  __l._M_len = (size_type)in_stack_fffffffffffff898;
  __l._M_array = in_stack_fffffffffffff890;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff888,__l,
             (allocator_type *)in_stack_fffffffffffff880);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  this_01 = (RPCResult *)&stack0xfffffffffffff9be;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  results = (pointer)0x0;
  args = (pointer)0x0;
  description = (pointer)0x0;
  this_00 = (RPCResults *)&stack0xfffffffffffff998;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff848);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),&in_stack_fffffffffffff8c0->m_names,
             in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,(RPCResult *)in_stack_fffffffffffff8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  HelpExampleCli(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  HelpExampleRpc(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  std::operator+(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff848,(string *)0x54e601);
  this = (RPCArg *)&stack0xfffffffffffff970;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::walletpassphrasechange()::__0,void>
            (in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0,
             &description->m_names,(vector<RPCArg,_std::allocator<RPCArg>_> *)args,
             (RPCResults *)results,in_stack_fffffffffffff990,in_stack_fffffffffffffab0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff994);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff995);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff996);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff997);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff858);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff9be);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff9bf);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff858);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_621);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_61a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_619);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_611);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_5f2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_5f1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan walletpassphrasechange()
{
    return RPCHelpMan{"walletpassphrasechange",
                "\nChanges the wallet passphrase from 'oldpassphrase' to 'newpassphrase'.\n",
                {
                    {"oldpassphrase", RPCArg::Type::STR, RPCArg::Optional::NO, "The current passphrase"},
                    {"newpassphrase", RPCArg::Type::STR, RPCArg::Optional::NO, "The new passphrase"},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("walletpassphrasechange", "\"old one\" \"new one\"")
            + HelpExampleRpc("walletpassphrasechange", "\"old one\", \"new one\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (!pwallet->IsCrypted()) {
        throw JSONRPCError(RPC_WALLET_WRONG_ENC_STATE, "Error: running with an unencrypted wallet, but walletpassphrasechange was called.");
    }

    if (pwallet->IsScanningWithPassphrase()) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: the wallet is currently being used to rescan the blockchain for related transactions. Please call `abortrescan` before changing the passphrase.");
    }

    LOCK2(pwallet->m_relock_mutex, pwallet->cs_wallet);

    SecureString strOldWalletPass;
    strOldWalletPass.reserve(100);
    strOldWalletPass = std::string_view{request.params[0].get_str()};

    SecureString strNewWalletPass;
    strNewWalletPass.reserve(100);
    strNewWalletPass = std::string_view{request.params[1].get_str()};

    if (strOldWalletPass.empty() || strNewWalletPass.empty()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "passphrase cannot be empty");
    }

    if (!pwallet->ChangeWalletPassphrase(strOldWalletPass, strNewWalletPass)) {
        // Check if the old passphrase had a null character (see #27067 for details)
        if (strOldWalletPass.find('\0') == std::string::npos) {
            throw JSONRPCError(RPC_WALLET_PASSPHRASE_INCORRECT, "Error: The wallet passphrase entered was incorrect.");
        } else {
            throw JSONRPCError(RPC_WALLET_PASSPHRASE_INCORRECT, "Error: The old wallet passphrase entered is incorrect. "
                                                                "It contains a null character (ie - a zero byte). "
                                                                "If the old passphrase was set with a version of this software prior to 25.0, "
                                                                "please try again with only the characters up to — but not including — "
                                                                "the first null character.");
        }
    }

    return UniValue::VNULL;
},
    };
}